

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu1.c
# Opt level: O3

MPP_RET hal_jpegd_vdpu1_start(void *hal,HalTaskInfo *task)

{
  undefined8 uVar1;
  MppIoctlVersion MVar2;
  RockchipSocType RVar3;
  MPP_RET MVar4;
  ulong uVar5;
  undefined4 uVar6;
  char *fmt;
  MPP_RET MVar7;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar1 = *(undefined8 *)((long)hal + 0x18);
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","enter\n","hal_jpegd_vdpu1_start");
  }
  uVar5 = (task->dec).flags.val;
  MVar4 = MPP_OK;
  if ((uVar5 & 4) == 0) {
    MVar2 = mpp_get_ioctl_version();
    RVar3 = mpp_get_soc_type();
    uVar6 = 0x98;
    if (MVar2 == IOCTL_VCODEC_SERVICE) {
      uVar6 = 0x194;
    }
    local_38 = 0x290;
    if (RVar3 == ROCKCHIP_SOC_RK3036) {
      local_38 = uVar6;
    }
    if (MVar2 != IOCTL_VCODEC_SERVICE) {
      local_38 = 0x194;
    }
    local_34 = 0;
    local_40 = uVar1;
    MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&local_40);
    if (MVar4 == MPP_OK) {
      local_48 = 0x194;
      local_50 = uVar1;
      MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,&local_50);
      if (MVar4 != MPP_OK) {
        fmt = "set register read failed %d\n";
        goto LAB_00210030;
      }
      MVar7 = MPP_OK;
      MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
      if (MVar4 == MPP_OK) goto joined_r0x0021005a;
      _mpp_log_l(2,"HAL_JPEGD_VDPU1","send cmd failed %d\n","hal_jpegd_vdpu1_start",
                 (ulong)(uint)MVar4);
    }
    else {
      fmt = "set register write failed %d\n";
LAB_00210030:
      _mpp_log_l(2,"HAL_JPEGD_VDPU1",fmt,"hal_jpegd_vdpu1_start",(ulong)(uint)MVar4);
    }
    uVar5 = (task->dec).flags.val;
  }
  (task->dec).flags.val = uVar5 | 4;
  MVar7 = MVar4;
joined_r0x0021005a:
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","exit\n","hal_jpegd_vdpu1_start");
  }
  return MVar7;
}

Assistant:

MPP_RET hal_jpegd_vdpu1_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    RK_U32 *regs = (RK_U32 *)JpegHalCtx->regs;

    jpegd_dbg_func("enter\n");
    if (task->dec.flags.parse_err)
        goto __RETURN;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        MppIoctlVersion ioctl_version = mpp_get_ioctl_version();
        RK_U32 reg_size = ioctl_version ?
                          sizeof(((JpegdIocRegInfo *)0)->regs) :
                          sizeof(JpegdIocRegInfo) - EXTRA_INFO_SIZE;

        if (ROCKCHIP_SOC_RK3036 == mpp_get_soc_type() &&
            IOCTL_VCODEC_SERVICE == ioctl_version)
            reg_size -= sizeof(((JpegdIocRegInfo *)0)->regs_diff);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            goto __RETURN;
        }

        reg_size = sizeof(((JpegdIocRegInfo *)0)->regs);

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            goto __RETURN;
        }

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            goto __RETURN;
        }
    } while (0);

    jpegd_dbg_func("exit\n");
    return ret;

__RETURN:
    task->dec.flags.parse_err = 1;

    jpegd_dbg_func("exit\n");
    return ret;
}